

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

region * __thiscall toml::detail::character_in_range::scan(character_in_range *this,location *loc)

{
  bool bVar1;
  byte bVar2;
  location *in_RSI;
  region *in_RDI;
  location first;
  char_type_conflict curr;
  location *in_stack_ffffffffffffff68;
  region *n;
  location *in_stack_ffffffffffffff88;
  location *in_stack_ffffffffffffff90;
  location *in_stack_ffffffffffffff98;
  region *in_stack_ffffffffffffffa0;
  
  n = in_RDI;
  bVar1 = location::eof((location *)in_RDI);
  if (bVar1) {
    region::region(in_stack_ffffffffffffffa0);
  }
  else {
    bVar2 = location::current(in_stack_ffffffffffffff68);
    if ((bVar2 < *(byte *)&(in_RSI->source_).
                           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi) ||
       (*(byte *)((long)&(in_RSI->source_).
                         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 1) < bVar2)) {
      region::region(in_stack_ffffffffffffffa0);
    }
    else {
      location::location(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      location::advance(in_RSI,(size_t)n);
      region::region(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      location::~location((location *)in_RDI);
    }
  }
  return n;
}

Assistant:

TOML11_INLINE region character_in_range::scan(location& loc) const
{
    if(loc.eof()) {return region{};}

    const auto curr = loc.current();
    if(this->from_ <= curr && curr <= this->to_)
    {
        const auto first = loc;
        loc.advance(1);
        return region(first, loc);
    }
    return region{};
}